

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O3

void __thiscall
wabt::interp::RefPtr<wabt::interp::Tag>::RefPtr
          (RefPtr<wabt::interp::Tag> *this,Store *store,Ref ref)

{
  Object *pOVar1;
  Tag *pTVar2;
  void *pvVar3;
  Index IVar4;
  interp *this_00;
  Ref local_20;
  
  pOVar1 = (store->objects_).list_.
           super__Vector_base<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>.
           _M_impl.super__Vector_impl_data._M_start[ref.index];
  if (((ulong)pOVar1 & 1) == 0) {
    this_00 = (interp *)(long)(int)pOVar1->kind_;
    if (this_00 != (interp *)0x9) {
      if (ref.index == 0) {
        this_00 = (interp *)0x0;
      }
      interp::RefPtr(this_00);
      *(undefined ***)this_00 = &PTR__FuncType_0017e100;
      pvVar3 = *(void **)(this_00 + 0x28);
      if (pvVar3 != (void *)0x0) {
        operator_delete(pvVar3,*(long *)(this_00 + 0x38) - (long)pvVar3);
      }
      pvVar3 = *(void **)(this_00 + 0x10);
      if (pvVar3 != (void *)0x0) {
        operator_delete(pvVar3,*(long *)(this_00 + 0x20) - (long)pvVar3);
        return;
      }
      return;
    }
    local_20.index = ref.index;
    IVar4 = FreeList<wabt::interp::Ref>::New<wabt::interp::Ref&>(&store->roots_,&local_20);
    this->root_index_ = IVar4;
    pTVar2 = (Tag *)(store->objects_).list_.
                    super__Vector_base<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>
                    ._M_impl.super__Vector_impl_data._M_start[ref.index];
    if (((ulong)pTVar2 & 1) == 0) {
      this->obj_ = pTVar2;
      this->store_ = store;
      return;
    }
  }
  else if (ref.index == 0) {
    interp::RefPtr((interp *)0x0);
  }
  __assert_fail("IsUsed(index)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/interp/interp-inl.h"
                ,0xe5,
                "T &wabt::interp::FreeList<wabt::interp::Object *>::Get(Index) [T = wabt::interp::Object *]"
               );
}

Assistant:

RefPtr<T>::RefPtr(Store& store, Ref ref) {
#ifndef NDEBUG
  if (!store.Is<T>(ref)) {
    ObjectKind ref_kind;
    if (ref == Ref::Null) {
      ref_kind = ObjectKind::Null;
    } else {
      ref_kind = store.objects_.Get(ref.index)->kind();
    }
    fprintf(stderr, "Invalid conversion from Ref (%s) to RefPtr<%s>!\n",
            GetName(ref_kind), T::GetTypeName());
    abort();
  }
#endif
  root_index_ = store.NewRoot(ref);
  obj_ = static_cast<T*>(store.objects_.Get(ref.index));
  store_ = &store;
}